

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O0

int raplcap_pd_set_limit
              (raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone,raplcap_constraint constraint
              ,raplcap_limit *limit)

{
  int iVar1;
  raplcap_msr *ctx;
  off_t msr_00;
  int *piVar2;
  int local_4c;
  int ret;
  off_t msr;
  raplcap_msr *state;
  uint64_t msrval;
  raplcap_limit *limit_local;
  raplcap_constraint constraint_local;
  raplcap_zone zone_local;
  uint32_t die_local;
  uint32_t pkg_local;
  raplcap *rc_local;
  
  msrval = (uint64_t)limit;
  limit_local._0_4_ = constraint;
  limit_local._4_4_ = zone;
  constraint_local = die;
  zone_local = pkg;
  _die_local = rc;
  ctx = get_state(rc,pkg,die);
  msr_00 = zone_to_msr_offset(limit_local._4_4_,ZONE_OFFSETS_PL);
  local_4c = 0;
  if ((ctx == (raplcap_msr *)0x0) || (msr_00 < 0)) {
    rc_local._4_4_ = -1;
  }
  else if (((int)(raplcap_constraint)limit_local < 0) || (2 < (int)(raplcap_constraint)limit_local))
  {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    rc_local._4_4_ = -1;
  }
  else {
    if ((raplcap_constraint)limit_local == RAPLCAP_CONSTRAINT_LONG_TERM) {
      iVar1 = msr_sys_read(ctx->sys,(uint64_t *)&state,zone_local,constraint_local,msr_00);
      if (iVar1 != 0) {
        return -1;
      }
      state = (raplcap_msr *)
              msr_set_limits(&ctx->ctx,limit_local._4_4_,(uint64_t)state,(raplcap_limit *)msrval,
                             (raplcap_limit *)0x0);
      local_4c = msr_sys_write(ctx->sys,(uint64_t)state,zone_local,constraint_local,msr_00);
    }
    else if ((raplcap_constraint)limit_local == RAPLCAP_CONSTRAINT_SHORT_TERM) {
      iVar1 = msr_sys_read(ctx->sys,(uint64_t *)&state,zone_local,constraint_local,msr_00);
      if (iVar1 != 0) {
        return -1;
      }
      state = (raplcap_msr *)
              msr_set_limits(&ctx->ctx,limit_local._4_4_,(uint64_t)state,(raplcap_limit *)0x0,
                             (raplcap_limit *)msrval);
      local_4c = msr_sys_write(ctx->sys,(uint64_t)state,zone_local,constraint_local,msr_00);
    }
    else if ((raplcap_constraint)limit_local == RAPLCAP_CONSTRAINT_PEAK_POWER) {
      iVar1 = msr_sys_read(ctx->sys,(uint64_t *)&state,zone_local,constraint_local,0x601);
      if (iVar1 != 0) {
        return -1;
      }
      if (msrval != 0) {
        state = (raplcap_msr *)
                msr_set_pl4_limit(&ctx->ctx,limit_local._4_4_,(uint64_t)state,
                                  *(double *)(msrval + 8));
        local_4c = msr_sys_write(ctx->sys,(uint64_t)state,zone_local,constraint_local,0x601);
      }
    }
    else {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      local_4c = -1;
    }
    rc_local._4_4_ = local_4c;
  }
  return rc_local._4_4_;
}

Assistant:

int raplcap_pd_set_limit(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone,
                         raplcap_constraint constraint, const raplcap_limit* limit) {
  uint64_t msrval;
  const raplcap_msr* state = get_state(rc, pkg, die);
  const off_t msr = zone_to_msr_offset(zone, ZONE_OFFSETS_PL);
  int ret = 0;
  raplcap_log(DEBUG, "raplcap_pd_set_limit: pkg=%"PRIu32", die=%"PRIu32", zone=%d, constraint=%d\n",
              pkg, die, zone, constraint);
  if (state == NULL || msr < 0) {
    return -1;
  }
  if ((int) constraint < 0 || (int) constraint >= RAPLCAP_NCONSTRAINTS) {
    errno = EINVAL;
    return -1;
  }
  switch (constraint) {
    case RAPLCAP_CONSTRAINT_LONG_TERM:
      if (msr_sys_read(state->sys, &msrval, pkg, die, msr)) {
        return -1;
      }
      msrval = msr_set_limits(&state->ctx, zone, msrval, limit, NULL);
      ret = msr_sys_write(state->sys, msrval, pkg, die, msr);
      break;
    case RAPLCAP_CONSTRAINT_SHORT_TERM:
      if (msr_sys_read(state->sys, &msrval, pkg, die, msr)) {
        return -1;
      }
      msrval = msr_set_limits(&state->ctx, zone, msrval, NULL, limit);
      ret = msr_sys_write(state->sys, msrval, pkg, die, msr);
      break;
    case RAPLCAP_CONSTRAINT_PEAK_POWER:
      if (msr_sys_read(state->sys, &msrval, pkg, die, MSR_VR_CURRENT_CONFIG)) {
        return -1;
      }
      if (limit) {
        msrval = msr_set_pl4_limit(&state->ctx, zone, msrval, limit->watts);
        ret = msr_sys_write(state->sys, msrval, pkg, die, MSR_VR_CURRENT_CONFIG);
      }
      break;
    default:
      // unreachable
      errno = EINVAL;
      ret = -1;
      break;
  }
  return ret;
}